

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::Texture2DShadowCase::iterate(Texture2DShadowCase *this)

{
  float *pfVar1;
  pointer pfVar2;
  ulong uVar3;
  int *piVar4;
  TestLog *log;
  RenderContext *context;
  pointer pFVar5;
  bool bVar6;
  int i;
  int iVar7;
  deUint32 dVar8;
  CompareMode CVar9;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  undefined8 *puVar11;
  long lVar12;
  NotSupportedError *this_00;
  char *description;
  qpTestResult testResult;
  ulong uVar13;
  TestContext *pTVar14;
  uint uVar15;
  void *pvVar16;
  pointer pFVar17;
  Surface rendered;
  vector<float,_std::allocator<float>_> texCoord;
  RandomViewport viewport;
  TexComparePrecision local_2c8;
  LodPrecision lodPrecision;
  undefined4 uStack_294;
  ulong local_290 [2];
  TextureFormat local_280;
  PixelFormat pixelFormat;
  ulong local_268 [3];
  ScopedLogSection section;
  ReferenceParams sampleParams;
  undefined1 local_1b0 [8];
  _func_int **pp_Stack_1a8;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  int aiStack_198 [2];
  void *local_190;
  undefined4 local_188;
  undefined8 local_184;
  undefined1 uStack_17c;
  undefined3 uStack_17b;
  undefined4 uStack_178;
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar7);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar15 = ((uint)this->m_caseNdx >> 0x10 ^ this->m_caseNdx ^ 0x3d) * 9;
  uVar15 = (uVar15 >> 4 ^ uVar15) * 0x27d4eb2d;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,pRVar10,0x40,0x40,uVar15 >> 0xf ^ dVar8 ^ uVar15);
  pFVar17 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::Texture2DShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_caseNdx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  piVar4 = local_2c8.uvwBits.m_data + 1;
  local_2c8.coordBits.m_data._0_8_ = piVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar3 = (long)rendered.m_pixels.m_ptr +
          CONCAT44(local_2c8.uvwBits.m_data[0],local_2c8.coordBits.m_data[2]);
  uVar13 = 0xf;
  if ((int *)local_2c8.coordBits.m_data._0_8_ != piVar4) {
    uVar13 = CONCAT44(local_2c8.uvwBits.m_data[2],local_2c8.uvwBits.m_data[1]);
  }
  if (uVar13 < uVar3) {
    uVar13 = 0xf;
    if ((size_t *)CONCAT44(rendered.m_height,rendered.m_width) != &rendered.m_pixels.m_cap) {
      uVar13 = rendered.m_pixels.m_cap;
    }
    if (uVar13 < uVar3) goto LAB_01162743;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&rendered,0,(char *)0x0,local_2c8.coordBits.m_data._0_8_);
  }
  else {
LAB_01162743:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_2c8,CONCAT44(rendered.m_height,rendered.m_width));
  }
  sampleParams.super_RenderParams._0_8_ = sampleParams.super_RenderParams.w.m_data + 1;
  pfVar1 = (float *)(puVar11 + 2);
  if ((float *)*puVar11 == pfVar1) {
    sampleParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    sampleParams.super_RenderParams.w.m_data[3] = *(float *)(puVar11 + 3);
    sampleParams.super_RenderParams.bias = *(float *)((long)puVar11 + 0x1c);
  }
  else {
    sampleParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    sampleParams.super_RenderParams._0_8_ = (float *)*puVar11;
  }
  sampleParams.super_RenderParams._8_8_ = puVar11[1];
  *puVar11 = pfVar1;
  puVar11[1] = 0;
  *(undefined1 *)pfVar1 = 0;
  pixelFormat._0_8_ = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelFormat,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar3 = CONCAT44(uStack_294,lodPrecision.lodBits) + pixelFormat._8_8_;
  uVar13 = 0xf;
  if ((ulong *)pixelFormat._0_8_ != local_268) {
    uVar13 = local_268[0];
  }
  if (uVar13 < uVar3) {
    uVar13 = 0xf;
    if ((ulong *)CONCAT44(lodPrecision.derivateBits,lodPrecision.rule) != local_290) {
      uVar13 = local_290[0];
    }
    if (uVar13 < uVar3) goto LAB_0116287f;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&lodPrecision,0,(char *)0x0,pixelFormat._0_8_);
  }
  else {
LAB_0116287f:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&pixelFormat,CONCAT44(lodPrecision.derivateBits,lodPrecision.rule))
    ;
  }
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  pfVar2 = (pointer)(puVar11 + 2);
  if ((pointer)*puVar11 == pfVar2) {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
  }
  else {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*puVar11;
  }
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)puVar11[1];
  *puVar11 = pfVar2;
  puVar11[1] = 0;
  *(undefined1 *)pfVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&sampleParams,(string *)&texCoord);
  if ((pointer *)
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((ulong *)CONCAT44(lodPrecision.derivateBits,lodPrecision.rule) != local_290) {
    operator_delete((ulong *)CONCAT44(lodPrecision.derivateBits,lodPrecision.rule),local_290[0] + 1)
    ;
  }
  if ((ulong *)pixelFormat._0_8_ != local_268) {
    operator_delete((void *)pixelFormat._0_8_,local_268[0] + 1);
  }
  if ((float *)sampleParams.super_RenderParams._0_8_ != sampleParams.super_RenderParams.w.m_data + 1
     ) {
    operator_delete((void *)sampleParams.super_RenderParams._0_8_,
                    sampleParams.super_RenderParams.w.m_data._4_8_ + 1);
  }
  if ((size_t *)CONCAT44(rendered.m_height,rendered.m_width) != &rendered.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(rendered.m_height,rendered.m_width),
                    rendered.m_pixels.m_cap + 1);
  }
  if ((int *)local_2c8.coordBits.m_data._0_8_ != piVar4) {
    operator_delete((void *)local_2c8.coordBits.m_data._0_8_,
                    CONCAT44(local_2c8.uvwBits.m_data[2],local_2c8.uvwBits.m_data[1]) + 1);
  }
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&sampleParams,TEXTURETYPE_2D);
  tcu::Surface::Surface(&rendered,viewport.width,viewport.height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((viewport.width < 0x40) || (viewport.height < 0x40)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Too small render target",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
               ,0x150);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)local_1b0,this->m_wrapS,this->m_wrapT,this->m_minFilter,
                    this->m_magFilter);
  sampleParams.sampler.magFilter = local_1a0;
  sampleParams.sampler.lodThreshold = (float)uStack_19c;
  sampleParams.sampler._24_8_ = aiStack_198;
  sampleParams.sampler.wrapS = local_1b0._0_4_;
  sampleParams.sampler.wrapT = local_1b0._4_4_;
  sampleParams.sampler._8_8_ = pp_Stack_1a8;
  sampleParams.sampler._32_8_ = local_190;
  sampleParams.sampler.borderColor.v.uData[1] = local_188;
  sampleParams.sampler.borderColor.v._8_8_ = local_184;
  sampleParams.sampler.seamlessCubeMap = (bool)uStack_17c;
  sampleParams.sampler._53_3_ = uStack_17b;
  sampleParams.sampler.depthStencilMode = uStack_178;
  CVar9 = glu::mapGLCompareFunc(this->m_compareFunc);
  sampleParams.sampler.compare = CVar9;
  sampleParams.super_RenderParams.samplerType = SAMPLERTYPE_SHADOW;
  sampleParams.lodMode = LODMODE_EXACT;
  sampleParams.super_RenderParams.ref = pFVar17->ref;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1a8,"Compare reference value =  ",0x1b);
  std::ostream::_M_insert<double>((double)sampleParams.super_RenderParams.ref);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1a8,"Texture coordinates: ",0x15);
  tcu::operator<<((ostream *)&pp_Stack_1a8,&pFVar17->minCoord);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1a8," -> ",4);
  tcu::operator<<((ostream *)&pp_Stack_1a8,&pFVar17->maxCoord);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
  std::ios_base::~ios_base(local_138);
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,&pFVar17->minCoord,&pFVar17->maxCoord);
  (**(code **)(lVar12 + 0xb8))(0xde1,pFVar17->texture->m_glTexture);
  (**(code **)(lVar12 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar12 + 0x1360))(0xde1,0x2800,this->m_magFilter);
  (**(code **)(lVar12 + 0x1360))(0xde1,0x2802,this->m_wrapS);
  (**(code **)(lVar12 + 0x1360))(0xde1,0x2803,this->m_wrapT);
  (**(code **)(lVar12 + 0x1360))(0xde1,0x884c,0x884e);
  (**(code **)(lVar12 + 0x1360))(0xde1,0x884d,this->m_compareFunc);
  (**(code **)(lVar12 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&sampleParams.super_RenderParams);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2c8.coordBits.m_data[0] = 8;
  local_2c8.coordBits.m_data[1] = 3;
  pvVar16 = (void *)rendered.m_pixels.m_cap;
  if (rendered.m_pixels.m_cap != 0) {
    pvVar16 = rendered.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2c8,rendered.m_width,
             rendered.m_height,1,pvVar16);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1b0);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  pixelFormat.redBits = (pRVar10->m_pixelFormat).redBits;
  pixelFormat.greenBits = (pRVar10->m_pixelFormat).greenBits;
  pixelFormat.blueBits = (pRVar10->m_pixelFormat).blueBits;
  pixelFormat.alphaBits = (pRVar10->m_pixelFormat).alphaBits;
  lodPrecision.rule = RULE_OPENGL;
  lVar12 = 0;
  do {
    local_2c8.coordBits.m_data[lVar12] = 0x16;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  lVar12 = 3;
  do {
    local_2c8.coordBits.m_data[lVar12] = 0x10;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 6);
  lodPrecision.derivateBits = 0x12;
  lodPrecision.lodBits = 6;
  local_2c8.coordBits.m_data[0] = 0x14;
  local_2c8.coordBits.m_data[1] = 0x14;
  local_2c8.coordBits.m_data[2] = 0;
  local_2c8.uvwBits.m_data[0] = 7;
  local_2c8.uvwBits.m_data[1] = 7;
  local_2c8.uvwBits.m_data[2] = 0;
  local_2c8.pcfBits = 5;
  local_2c8.referenceBits = 0x10;
  local_2c8.resultBits = pixelFormat.redBits + -1;
  pTVar14 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  local_280.order = RGBA;
  local_280.type = UNORM_INT8;
  pvVar16 = (void *)rendered.m_pixels.m_cap;
  if (rendered.m_pixels.m_cap != 0) {
    pvVar16 = rendered.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_280,rendered.m_width,rendered.m_height,1,pvVar16)
  ;
  bVar6 = verifyTexCompareResult<tcu::Texture2D>
                    (pTVar14,(ConstPixelBufferAccess *)local_1b0,&pFVar17->texture->m_refTexture,
                     texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,&sampleParams,&local_2c8,&lodPrecision,
                     &pixelFormat);
  if (!bVar6) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1a8,
               "Warning: Verification assuming high-quality PCF filtering failed.",0x41);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
    std::ios_base::~ios_base(local_138);
    lodPrecision.lodBits = 4;
    local_2c8.uvwBits.m_data[0] = 4;
    local_2c8.uvwBits.m_data[1] = 4;
    local_2c8.uvwBits.m_data[2] = 0;
    local_2c8.pcfBits = 0;
    pTVar14 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    local_280.order = RGBA;
    local_280.type = UNORM_INT8;
    if (rendered.m_pixels.m_cap != 0) {
      rendered.m_pixels.m_cap = (size_t)rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,&local_280,rendered.m_width,rendered.m_height,1,
               (void *)rendered.m_pixels.m_cap);
    bVar6 = verifyTexCompareResult<tcu::Texture2D>
                      (pTVar14,(ConstPixelBufferAccess *)local_1b0,&pFVar17->texture->m_refTexture,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,&sampleParams,&local_2c8,&lodPrecision,
                       &pixelFormat);
    if (bVar6) {
      pTVar14 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (pTVar14->m_testResult != QP_TEST_RESULT_PASS) goto LAB_01162f8d;
      description = "Low-quality result";
      testResult = QP_TEST_RESULT_QUALITY_WARNING;
    }
    else {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1a8,
                 "ERROR: Verification against low precision requirements failed, failing test case."
                 ,0x51);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
      std::ios_base::~ios_base(local_138);
      pTVar14 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Image verification failed";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(pTVar14,testResult,description);
  }
LAB_01162f8d:
  iVar7 = this->m_caseNdx + 1;
  this->m_caseNdx = iVar7;
  pFVar17 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::Texture2DShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar5 = (this->m_cases).
           super__Vector_base<deqp::gles3::Functional::Texture2DShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&rendered);
  tcu::TestLog::endSection(section.m_log);
  return (IterateResult)(iVar7 < (int)((ulong)((long)pFVar5 - (long)pFVar17) >> 5));
}

Assistant:

Texture2DShadowCase::IterateResult Texture2DShadowCase::iterate (void)
{
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	const RandomViewport			viewport		(m_context.getRenderTarget(), TEX2D_VIEWPORT_WIDTH, TEX2D_VIEWPORT_HEIGHT, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					sampleParams	(TEXTURETYPE_2D);
	tcu::Surface					rendered		(viewport.width, viewport.height);
	vector<float>					texCoord;

	if (viewport.width < TEX2D_MIN_VIEWPORT_WIDTH || viewport.height < TEX2D_MIN_VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small render target", "", __FILE__, __LINE__);

	// Setup params for reference.
	sampleParams.sampler			= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	sampleParams.sampler.compare	= glu::mapGLCompareFunc(m_compareFunc);
	sampleParams.samplerType		= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode			= LODMODE_EXACT;
	sampleParams.ref				= curCase.ref;

	m_testCtx.getLog() << TestLog::Message << "Compare reference value =  " << sampleParams.ref << TestLog::EndMessage;

	// Compute texture coordinates.
	m_testCtx.getLog() << TestLog::Message << "Texture coordinates: " << curCase.minCoord << " -> " << curCase.maxCoord << TestLog::EndMessage;
	computeQuadTexCoord2D(texCoord, curCase.minCoord, curCase.maxCoord);

	gl.bindTexture	(GL_TEXTURE_2D, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,		m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,		m_magFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,			m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,			m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE,	GL_COMPARE_REF_TO_TEXTURE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC,	m_compareFunc);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer.renderQuad(0, &texCoord[0], sampleParams);
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, rendered.getAccess());

	{
		const tcu::PixelFormat		pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		tcu::LodPrecision			lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
		tcu::TexComparePrecision	texComparePrecision;

		lodPrecision.derivateBits			= 18;
		lodPrecision.lodBits				= 6;
		texComparePrecision.coordBits		= tcu::IVec3(20,20,0);
		texComparePrecision.uvwBits			= tcu::IVec3(7,7,0);
		texComparePrecision.pcfBits			= 5;
		texComparePrecision.referenceBits	= 16;
		texComparePrecision.resultBits		= pixelFormat.redBits-1;

		const bool isHighQuality = verifyTexCompareResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
														  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			m_testCtx.getLog() << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

			lodPrecision.lodBits			= 4;
			texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
			texComparePrecision.pcfBits		= 0;

			const bool isOk = verifyTexCompareResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
													 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
			}
			else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality result");
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}